

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

char * absl::lts_20250127::debugging_internal::anon_unknown_0::BasicTypeName(char c)

{
  char *pcStack_10;
  char c_local;
  
  switch(c) {
  case 'a':
    pcStack_10 = "i8";
    break;
  case 'b':
    pcStack_10 = "bool";
    break;
  case 'c':
    pcStack_10 = "char";
    break;
  case 'd':
    pcStack_10 = "f64";
    break;
  case 'e':
    pcStack_10 = "str";
    break;
  case 'f':
    pcStack_10 = "f32";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case 'h':
    pcStack_10 = "u8";
    break;
  case 'i':
    pcStack_10 = "isize";
    break;
  case 'j':
    pcStack_10 = "usize";
    break;
  case 'l':
    pcStack_10 = "i32";
    break;
  case 'm':
    pcStack_10 = "u32";
    break;
  case 'n':
    pcStack_10 = "i128";
    break;
  case 'o':
    pcStack_10 = "u128";
    break;
  case 'p':
    pcStack_10 = "_";
    break;
  case 's':
    pcStack_10 = "i16";
    break;
  case 't':
    pcStack_10 = "u16";
    break;
  case 'u':
    pcStack_10 = "()";
    break;
  case 'v':
    pcStack_10 = "...";
    break;
  case 'x':
    pcStack_10 = "i64";
    break;
  case 'y':
    pcStack_10 = "u64";
    break;
  case 'z':
    pcStack_10 = "!";
  }
  return pcStack_10;
}

Assistant:

const char* BasicTypeName(char c) {
  switch (c) {
    case 'a': return "i8";
    case 'b': return "bool";
    case 'c': return "char";
    case 'd': return "f64";
    case 'e': return "str";
    case 'f': return "f32";
    case 'h': return "u8";
    case 'i': return "isize";
    case 'j': return "usize";
    case 'l': return "i32";
    case 'm': return "u32";
    case 'n': return "i128";
    case 'o': return "u128";
    case 'p': return "_";
    case 's': return "i16";
    case 't': return "u16";
    case 'u': return "()";
    case 'v': return "...";
    case 'x': return "i64";
    case 'y': return "u64";
    case 'z': return "!";
  }
  return nullptr;
}